

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdial.cpp
# Opt level: O3

void QDial::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  
  if (_c == WriteProperty) {
    pbVar3 = (byte *)*_a;
    if (_id != 3) {
      if (_id == 2) {
        *(undefined8 *)(*(long *)(_o + 8) + 0x290) = *(undefined8 *)pbVar3;
        goto LAB_003ed19e;
      }
      if (_id != 0) {
        return;
      }
      goto LAB_003ed167;
    }
  }
  else {
    if (_c == ReadProperty) {
      if ((uint)_id < 4) {
        pbVar3 = (byte *)*_a;
        switch(_id) {
        case 0:
          bVar1 = *(byte *)(*(long *)(_o + 8) + 0x298) >> 1;
          break;
        case 1:
          iVar2 = notchSize((QDial *)_o);
          *(int *)pbVar3 = iVar2;
          return;
        case 2:
          *(undefined8 *)pbVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0x290);
          return;
        case 3:
          bVar1 = *(byte *)(*(long *)(_o + 8) + 0x298);
        }
        *pbVar3 = bVar1 & 1;
        return;
      }
      return;
    }
    if (_c != InvokeMetaMethod) {
      return;
    }
    if (_id == 1) {
      pbVar3 = (byte *)_a[1];
LAB_003ed167:
      bVar1 = *(byte *)(*(long *)(_o + 8) + 0x298);
      if (((bVar1 & 2) == 0) != (bool)*pbVar3) {
        return;
      }
      *(byte *)(*(long *)(_o + 8) + 0x298) = bVar1 & 0xfd | *pbVar3 * '\x02';
      goto LAB_003ed19e;
    }
    if (_id != 0) {
      return;
    }
    pbVar3 = (byte *)_a[1];
  }
  *(byte *)(*(long *)(_o + 8) + 0x298) = *(byte *)(*(long *)(_o + 8) + 0x298) & 0xfe | *pbVar3;
LAB_003ed19e:
  QWidget::update((QWidget *)_o);
  return;
}

Assistant:

void QDial::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDial *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->setNotchesVisible((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->setWrapping((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->wrapping(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->notchSize(); break;
        case 2: *reinterpret_cast<qreal*>(_v) = _t->notchTarget(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->notchesVisible(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWrapping(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNotchTarget(*reinterpret_cast<qreal*>(_v)); break;
        case 3: _t->setNotchesVisible(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}